

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallExpression.cpp
# Opt level: O2

void __thiscall slang::ast::DriverVisitor::handle(DriverVisitor *this,ValueExpressionBase *expr)

{
  undefined1 *this_00;
  char *pcVar1;
  SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *this_01;
  undefined4 uVar2;
  ValueSymbol *this_02;
  ulong uVar3;
  SubroutineSymbol *pSVar4;
  Scope *pSVar5;
  uint uVar6;
  undefined1 auVar7 [16];
  bool bVar8;
  value_type *elements;
  Scope *pSVar9;
  ulong pos0;
  SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *ctx;
  ValueSymbol *pVVar10;
  ulong hash;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  byte bVar18;
  undefined1 auVar19 [16];
  const_iterator it;
  SmallVector<std::pair<std::pair<unsigned_long,_unsigned_long>,_const_slang::ast::ValueDriver_*>,_2UL>
  drivers;
  subrange<slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_(std::ranges::subrange_kind)0>
  range;
  const_iterator local_188;
  char local_148;
  char cStack_147;
  char cStack_146;
  byte bStack_145;
  char cStack_144;
  char cStack_143;
  char cStack_142;
  byte bStack_141;
  char cStack_140;
  char cStack_13f;
  char cStack_13e;
  byte bStack_13d;
  char cStack_13c;
  char cStack_13b;
  char cStack_13a;
  byte bStack_139;
  undefined1 local_138 [72];
  undefined1 local_f0 [16];
  size_type local_e0;
  subrange<slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_(std::ranges::subrange_kind)0>
  local_b0;
  
  this_02 = expr->symbol;
  this_00 = &(this->visitedValues).super_Storage.field_0x48;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = this_02;
  hash = SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),8) ^
         SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),0);
  pos0 = hash >> ((this->visitedValues).field_0x50 & 0x3f);
  uVar2 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[hash & 0xff];
  uVar3 = *(ulong *)&(this->visitedValues).field_0x58;
  uVar11 = 0;
  uVar14 = pos0;
  do {
    pcVar1 = (char *)(*(long *)&(this->visitedValues).field_0x60 + uVar14 * 0x10);
    local_148 = *pcVar1;
    cStack_147 = pcVar1[1];
    cStack_146 = pcVar1[2];
    bStack_145 = pcVar1[3];
    cStack_144 = pcVar1[4];
    cStack_143 = pcVar1[5];
    cStack_142 = pcVar1[6];
    bStack_141 = pcVar1[7];
    cStack_140 = pcVar1[8];
    cStack_13f = pcVar1[9];
    cStack_13e = pcVar1[10];
    bStack_13d = pcVar1[0xb];
    cStack_13c = pcVar1[0xc];
    cStack_13b = pcVar1[0xd];
    cStack_13a = pcVar1[0xe];
    bStack_139 = pcVar1[0xf];
    cVar15 = (char)uVar2;
    auVar19[0] = -(local_148 == cVar15);
    cVar16 = (char)((uint)uVar2 >> 8);
    auVar19[1] = -(cStack_147 == cVar16);
    cVar17 = (char)((uint)uVar2 >> 0x10);
    auVar19[2] = -(cStack_146 == cVar17);
    bVar18 = (byte)((uint)uVar2 >> 0x18);
    auVar19[3] = -(bStack_145 == bVar18);
    auVar19[4] = -(cStack_144 == cVar15);
    auVar19[5] = -(cStack_143 == cVar16);
    auVar19[6] = -(cStack_142 == cVar17);
    auVar19[7] = -(bStack_141 == bVar18);
    auVar19[8] = -(cStack_140 == cVar15);
    auVar19[9] = -(cStack_13f == cVar16);
    auVar19[10] = -(cStack_13e == cVar17);
    auVar19[0xb] = -(bStack_13d == bVar18);
    auVar19[0xc] = -(cStack_13c == cVar15);
    auVar19[0xd] = -(cStack_13b == cVar16);
    auVar19[0xe] = -(cStack_13a == cVar17);
    auVar19[0xf] = -(bStack_139 == bVar18);
    uVar12 = (uint)(ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe);
    if (uVar12 != 0) {
      do {
        uVar6 = 0;
        if (uVar12 != 0) {
          for (; (uVar12 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
          }
        }
        if (this_02 ==
            *(ValueSymbol **)
             (*(long *)&(this->visitedValues).field_0x68 + uVar14 * 0x78 + (ulong)uVar6 * 8)) {
          return;
        }
        uVar12 = uVar12 - 1 & uVar12;
      } while (uVar12 != 0);
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bStack_139) == 0) break;
    lVar13 = uVar14 + uVar11;
    uVar11 = uVar11 + 1;
    uVar14 = lVar13 + 1U & uVar3;
  } while (uVar11 <= uVar3);
  local_138._0_8_ = this_02;
  if (*(ulong *)&(this->visitedValues).field_0x78 < *(ulong *)&(this->visitedValues).field_0x70) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::ValueSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::ValueSymbol_const*,64ul,16ul>>
    ::unchecked_emplace_at<slang::ast::ValueSymbol_const*>
              ((locator *)&local_b0,
               (table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::ValueSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::ValueSymbol_const*,64ul,16ul>>
                *)this_00,pos0,hash,(ValueSymbol **)local_138);
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::ValueSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::ValueSymbol_const*,64ul,16ul>>
    ::unchecked_emplace_with_rehash<slang::ast::ValueSymbol_const*>
              ((locator *)&local_b0,
               (table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::ValueSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<slang::ast::ValueSymbol_const*,64ul,16ul>>
                *)this_00,hash,(ValueSymbol **)local_138);
  }
  pSVar4 = this->sub;
  if (((((pSVar4->super_Scope).compilation)->options).flags.m_bits & 0x1000) != 0) {
    pSVar9 = &pSVar4->super_Scope;
    pVVar10 = this_02;
    do {
      pSVar5 = (pVVar10->super_Symbol).parentScope;
      if (pSVar5 == (Scope *)0x0) break;
      pVVar10 = (ValueSymbol *)pSVar5->thisSym;
    } while ((pVVar10->super_Symbol).kind == StatementBlock);
    if (pSVar4 == (SubroutineSymbol *)0x0) {
      pSVar9 = (Scope *)0x0;
    }
    if (pSVar5 == pSVar9) {
      return;
    }
  }
  local_138._0_8_ = local_138 + 0x18;
  local_138._8_8_ = 0;
  local_138._16_8_ = 2;
  ValueSymbol::drivers(&local_b0,this_02);
  IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator::const_iterator
            (&local_188,&local_b0._M_begin);
  this_01 = (SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)(local_f0 + 8);
  while( true ) {
    IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator::const_iterator
              ((const_iterator *)local_f0,&local_b0._M_end);
    ctx = this_01;
    bVar8 = IntervalMapDetails::Path::operator==(&local_188.path,(Path *)this_01);
    SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::cleanup(this_01,(EVP_PKEY_CTX *)ctx);
    if (bVar8) break;
    if (*(SubroutineSymbol **)
         (*(long *)((long)local_188.path.path.
                          super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
                          [local_188.path.path.
                           super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1].
                          node +
                   (ulong)local_188.path.path.
                          super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
                          [local_188.path.path.
                           super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1].
                          offset * 8 + 0x80) + 8) == this->sub) {
      local_f0 = (undefined1  [16])
                 IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator::
                 bounds(&local_188);
      local_e0 = *(size_type *)
                  ((long)local_188.path.path.
                         super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
                         [local_188.path.path.
                          super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1].
                         node +
                  (ulong)local_188.path.path.
                         super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
                         [local_188.path.path.
                          super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1].
                         offset * 8 + 0x80);
      SmallVectorBase<std::pair<std::pair<unsigned_long,unsigned_long>,slang::ast::ValueDriver_const*>>
      ::
      emplace_back<std::pair<std::pair<unsigned_long,unsigned_long>,slang::ast::ValueDriver_const*>>
                ((SmallVectorBase<std::pair<std::pair<unsigned_long,unsigned_long>,slang::ast::ValueDriver_const*>>
                  *)local_138,
                 (pair<std::pair<unsigned_long,_unsigned_long>,_const_slang::ast::ValueDriver_*> *)
                 local_f0);
    }
    IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator::operator++
              (&local_188);
  }
  SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::cleanup
            ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)&local_188.path,
             (EVP_PKEY_CTX *)ctx);
  pVVar10 = (ValueSymbol *)local_138._0_8_;
  for (lVar13 = local_138._8_8_ * 0x18; lVar13 != 0; lVar13 = lVar13 + -0x18) {
    ctx = (SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)0x0;
    ValueSymbol::addDriver
              (this_02,Procedural,*(DriverBitRange *)&pVVar10->super_Symbol,
               *(Expression **)(pVVar10->super_Symbol).name._M_str,this->procedure,this->callExpr);
    pVVar10 = (ValueSymbol *)&(pVVar10->super_Symbol).location;
  }
  std::ranges::
  subrange<slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_(std::ranges::subrange_kind)0>
  ::~subrange(&local_b0);
  SmallVectorBase<std::pair<std::pair<unsigned_long,_unsigned_long>,_const_slang::ast::ValueDriver_*>_>
  ::cleanup((SmallVectorBase<std::pair<std::pair<unsigned_long,_unsigned_long>,_const_slang::ast::ValueDriver_*>_>
             *)local_138,(EVP_PKEY_CTX *)ctx);
  return;
}

Assistant:

void handle(const ValueExpressionBase& expr) {
        auto& sym = expr.symbol;
        if (!visitedValues.emplace(&sym).second)
            return;

        if (sub.getCompilation().hasFlag(CompilationFlags::AllowMultiDrivenLocals)) {
            auto scope = sym.getParentScope();
            while (scope && scope->asSymbol().kind == SymbolKind::StatementBlock)
                scope = scope->asSymbol().getParentScope();

            if (scope == &sub) {
                // This is a local variable of the subroutine,
                // so don't do driver checking.
                return;
            }
        }

        // If the target symbol is driven by the subroutine we're inspecting,
        // add another driver for the procedure we're originally called from.
        SmallVector<std::pair<DriverBitRange, const ValueDriver*>> drivers;
        auto range = sym.drivers();
        for (auto it = range.begin(); it != range.end(); ++it) {
            if ((*it)->containingSymbol == &sub)
                drivers.push_back({it.bounds(), *it});
        }

        // This needs to be a separate loop to avoid mutating the driver map
        // while iterating over it.
        for (auto [bounds, driver] : drivers) {
            sym.addDriver(DriverKind::Procedural, bounds, *driver->prefixExpression, procedure,
                          callExpr);
        }
    }